

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Minisat::Solver::analyze
          (Solver *this,CRef confl,vec<Minisat::Lit> *out_learnt,int *out_btlevel,int *out_lbd)

{
  uint64_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  Lit LVar5;
  int iVar6;
  int iVar7;
  CRef CVar8;
  Clause *pCVar9;
  Lit *pLVar10;
  uint32_t *puVar11;
  char *pcVar12;
  uint *puVar13;
  Lit *pLVar14;
  int *in_RCX;
  vec<Minisat::Lit> *in_RDX;
  CRef in_ESI;
  Solver *in_RDI;
  int *in_R8;
  int j_2;
  Lit l;
  int i_4;
  Clause *reaC;
  CRef rea;
  Var v_1;
  int i_3;
  Var v;
  int i_2;
  Lit p_1;
  int i_1;
  int max_bump_size;
  int max_i;
  int k;
  Clause *c_1;
  Var x;
  uint32_t abstract_level;
  int j;
  int i;
  Lit q;
  int j_1;
  int lbd;
  Lit tmp;
  Clause *c;
  int nDecisionLevel;
  int index;
  Lit p;
  int pathC;
  Lit *in_stack_fffffffffffffdd8;
  vec<char> *pvVar15;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  Solver *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  vec<unsigned_int> *this_00;
  vec<Minisat::Lit> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  Solver *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  Lit *in_stack_fffffffffffffe60;
  vec<Minisat::Lit> *out_learnt_00;
  Solver *in_stack_fffffffffffffe80;
  bool local_149;
  int local_138;
  int local_124;
  int local_108;
  int local_f8;
  int local_e4;
  int local_dc;
  uint local_d0;
  int local_a4;
  int local_a0;
  uint local_64;
  lbool local_55;
  int local_54;
  lbool local_4d;
  undefined4 local_4c;
  Clause *local_48;
  int local_3c;
  int local_38;
  int local_34;
  Lit local_30;
  int local_2c;
  int *local_28;
  int *local_20;
  vec<Minisat::Lit> *local_18;
  CRef local_c;
  
  local_2c = 0;
  local_30.x = -2;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  vec<Minisat::Lit>::push
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  local_34 = vec<Minisat::Lit>::size(&in_RDI->trail);
  local_34 = local_34 + -1;
  pCVar9 = ClauseAllocator::operator[]
                     ((ClauseAllocator *)
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      (Ref)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  pLVar10 = Clause::operator[](pCVar9,0);
  local_3c = pLVar10->x;
  var((Lit)local_3c);
  local_38 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  do {
    local_48 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)
                          CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          (Ref)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    (in_RDI->statistics).solveSteps = (in_RDI->statistics).solveSteps + 1;
    local_4c = 0xfffffffe;
    bVar2 = Lit::operator!=(&local_30,(Lit)0xfffffffe);
    local_149 = false;
    if (bVar2) {
      iVar4 = Clause::size(local_48);
      local_149 = false;
      if (iVar4 == 2) {
        pLVar10 = Clause::operator[](local_48,0);
        local_54 = pLVar10->x;
        local_4d = value(in_stack_fffffffffffffde8,(Lit)(int)in_stack_fffffffffffffdf0);
        lbool::lbool(&local_55,'\x01');
        local_149 = lbool::operator==(&local_4d,local_55);
      }
    }
    if (local_149 != false) {
      pLVar10 = Clause::operator[](local_48,0);
      iVar4 = pLVar10->x;
      pLVar10 = Clause::operator[](local_48,1);
      pLVar14 = Clause::operator[](local_48,0);
      pLVar14->x = pLVar10->x;
      pLVar10 = Clause::operator[](local_48,1);
      pLVar10->x = iVar4;
    }
    bVar2 = Clause::learnt(local_48);
    if (bVar2) {
      uVar3 = Clause::mark(local_48);
      if (uVar3 == 3) {
        uVar1 = in_RDI->conflicts;
        puVar11 = Clause::touched(local_48);
        *puVar11 = (uint32_t)uVar1;
      }
      else {
        iVar4 = computeLBD<Minisat::Clause>
                          (in_stack_fffffffffffffe08,
                           (Clause *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        iVar6 = Clause::lbd(local_48);
        if (iVar4 < iVar6) {
          iVar6 = Clause::lbd(local_48);
          if (iVar6 < 0x1f) {
            Clause::removable(local_48,false);
          }
          Clause::set_lbd(local_48,iVar4);
          if (in_RDI->core_lbd_cut < iVar4) {
            if ((iVar4 < 7) && (uVar3 = Clause::mark(local_48), uVar3 == 0)) {
              vec<unsigned_int>::push
                        ((vec<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         (uint *)in_stack_fffffffffffffdd8);
              Clause::mark(local_48,2);
            }
          }
          else {
            vec<unsigned_int>::push
                      ((vec<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       (uint *)in_stack_fffffffffffffdd8);
            Clause::mark(local_48,3);
          }
        }
        uVar3 = Clause::mark(local_48);
        if (uVar3 == 2) {
          uVar1 = in_RDI->conflicts;
          puVar11 = Clause::touched(local_48);
          *puVar11 = (uint32_t)uVar1;
        }
        else {
          uVar3 = Clause::mark(local_48);
          if (uVar3 == 0) {
            claBumpActivity((Solver *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (Clause *)in_stack_fffffffffffffdf8);
          }
        }
      }
    }
    bVar2 = Lit::operator==(&local_30,(Lit)0xfffffffe);
    for (local_64 = (uint)!bVar2; iVar4 = Clause::size(local_48), (int)local_64 < iVar4;
        local_64 = local_64 + 1) {
      pLVar10 = Clause::operator[](local_48,local_64);
      LVar5.x = pLVar10->x;
      iVar4 = var(LVar5);
      pcVar12 = vec<char>::operator[](&in_RDI->seen,iVar4);
      if (*pcVar12 == '\0') {
        var(LVar5);
        iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        if (0 < iVar4) {
          bVar2 = usesVSIDS(in_RDI);
          if (bVar2) {
            var(LVar5);
            varBumpActivity((Solver *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (Var)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                            (double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
            vec<Minisat::Lit>::push
                      ((vec<Minisat::Lit> *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
          }
          else {
            iVar4 = var(LVar5);
            puVar13 = vec<unsigned_int>::operator[](&in_RDI->conflicted,iVar4);
            *puVar13 = *puVar13 + 1;
          }
          in_stack_fffffffffffffe80 = (Solver *)&in_RDI->seen;
          iVar4 = var(LVar5);
          pcVar12 = vec<char>::operator[]((vec<char> *)in_stack_fffffffffffffe80,iVar4);
          *pcVar12 = '\x01';
          var(LVar5);
          iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
          if (iVar4 < local_38) {
            vec<Minisat::Lit>::push
                      ((vec<Minisat::Lit> *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
          }
          else {
            local_2c = local_2c + 1;
          }
        }
      }
    }
    do {
      do {
        iVar4 = local_34;
        out_learnt_00 = (vec<Minisat::Lit> *)&in_RDI->seen;
        local_34 = local_34 + -1;
        pLVar10 = vec<Minisat::Lit>::operator[](&in_RDI->trail,iVar4);
        iVar4 = var((Lit)pLVar10->x);
        pcVar12 = vec<char>::operator[]((vec<char> *)out_learnt_00,iVar4);
      } while (*pcVar12 == '\0');
      pLVar10 = vec<Minisat::Lit>::operator[](&in_RDI->trail,local_34 + 1);
      local_30.x = pLVar10->x;
      var(local_30);
      iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    } while (iVar4 < local_38);
    var(local_30);
    local_c = reason((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    pvVar15 = &in_RDI->seen;
    iVar4 = var(local_30);
    pcVar12 = vec<char>::operator[](pvVar15,iVar4);
    *pcVar12 = '\0';
    local_2c = local_2c + -1;
  } while (0 < local_2c);
  LVar5 = operator~(local_30);
  pLVar10 = vec<Minisat::Lit>::operator[](local_18,0);
  pLVar10->x = LVar5.x;
  vec<Minisat::Lit>::copyTo
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8);
  if (in_RDI->ccmin_mode == 2) {
    local_a0 = 1;
    while (iVar4 = local_a0, iVar6 = vec<Minisat::Lit>::size(local_18), iVar4 < iVar6) {
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
      var((Lit)pLVar10->x);
      abstractLevel((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      local_a0 = local_a0 + 1;
    }
    local_a4 = 1;
    local_a0 = 1;
    while (iVar6 = local_a0, iVar7 = vec<Minisat::Lit>::size(local_18), iVar6 < iVar7) {
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
      var((Lit)pLVar10->x);
      CVar8 = reason((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (CVar8 == 0xffffffff) {
LAB_00133a99:
        in_stack_fffffffffffffe60 = vec<Minisat::Lit>::operator[](local_18,local_a0);
        pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a4);
        pLVar10->x = in_stack_fffffffffffffe60->x;
        local_a4 = local_a4 + 1;
      }
      else {
        vec<Minisat::Lit>::operator[](local_18,local_a0);
        bVar2 = litRedundant((Solver *)CONCAT44(iVar4,iVar6),(Lit)(int)pvVar15,
                             (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        if (!bVar2) goto LAB_00133a99;
      }
      local_a0 = local_a0 + 1;
    }
  }
  else if (in_RDI->ccmin_mode == 1) {
    local_a4 = 1;
    for (local_a0 = 1; iVar4 = vec<Minisat::Lit>::size(local_18), local_a0 < iVar4;
        local_a0 = local_a0 + 1) {
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
      var((Lit)pLVar10->x);
      CVar8 = reason((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (CVar8 == 0xffffffff) {
        pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
        pLVar14 = vec<Minisat::Lit>::operator[](local_18,local_a4);
        pLVar14->x = pLVar10->x;
        local_a4 = local_a4 + 1;
      }
      else {
        pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
        var((Lit)pLVar10->x);
        reason((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        pCVar9 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (Ref)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        (in_RDI->statistics).solveSteps = (in_RDI->statistics).solveSteps + 1;
        iVar4 = Clause::size(pCVar9);
        for (local_d0 = (uint)(iVar4 != 2); iVar4 = Clause::size(pCVar9), (int)local_d0 < iVar4;
            local_d0 = local_d0 + 1) {
          pLVar10 = Clause::operator[](pCVar9,local_d0);
          iVar4 = var((Lit)pLVar10->x);
          pcVar12 = vec<char>::operator[](&in_RDI->seen,iVar4);
          if (*pcVar12 == '\0') {
            pLVar10 = Clause::operator[](pCVar9,local_d0);
            var((Lit)pLVar10->x);
            iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            if (0 < iVar4) {
              pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_a0);
              pLVar14 = vec<Minisat::Lit>::operator[](local_18,local_a4);
              pLVar14->x = pLVar10->x;
              local_a4 = local_a4 + 1;
              break;
            }
          }
        }
      }
    }
  }
  else {
    local_a4 = vec<Minisat::Lit>::size(local_18);
    local_a0 = local_a4;
  }
  iVar4 = vec<Minisat::Lit>::size(local_18);
  in_RDI->max_literals = (long)iVar4 + in_RDI->max_literals;
  vec<Minisat::Lit>::shrink(local_18,local_a0 - local_a4);
  iVar4 = vec<Minisat::Lit>::size(local_18);
  in_RDI->tot_literals = (long)iVar4 + in_RDI->tot_literals;
  iVar4 = computeLBD<Minisat::vec<Minisat::Lit>>
                    (in_stack_fffffffffffffe08,
                     (vec<Minisat::Lit> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  *local_28 = iVar4;
  if (((*local_28 < 7) && (iVar4 = vec<Minisat::Lit>::size(local_18), iVar4 < 0x1f)) &&
     (bVar2 = binResMinimize(in_stack_fffffffffffffe80,out_learnt_00), bVar2)) {
    iVar4 = computeLBD<Minisat::vec<Minisat::Lit>>
                      (in_stack_fffffffffffffe08,
                       (vec<Minisat::Lit> *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    *local_28 = iVar4;
  }
  iVar4 = vec<Minisat::Lit>::size(local_18);
  if (iVar4 == 1) {
    *local_20 = 0;
  }
  else {
    local_dc = 1;
    iVar4 = in_RDI->max_activity_bump_size;
    iVar6 = vec<Minisat::Lit>::size(local_18);
    if (iVar6 <= iVar4) {
      vec<Minisat::Lit>::size(local_18);
    }
    for (local_e4 = 2; iVar4 = vec<Minisat::Lit>::size(local_18), local_e4 < iVar4;
        local_e4 = local_e4 + 1) {
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_e4);
      var((Lit)pLVar10->x);
      iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_dc);
      var((Lit)pLVar10->x);
      iVar6 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (iVar6 < iVar4) {
        local_dc = local_e4;
      }
    }
    pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_dc);
    LVar5.x = pLVar10->x;
    pLVar10 = vec<Minisat::Lit>::operator[](local_18,1);
    pLVar14 = vec<Minisat::Lit>::operator[](local_18,local_dc);
    pLVar14->x = pLVar10->x;
    pLVar10 = vec<Minisat::Lit>::operator[](local_18,1);
    pLVar10->x = LVar5.x;
    var(LVar5);
    iVar4 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    *local_20 = iVar4;
  }
  bVar2 = usesVSIDS(in_RDI);
  if (bVar2) {
    local_f8 = 0;
    while (iVar4 = local_f8, iVar6 = vec<Minisat::Lit>::size(&in_RDI->add_tmp), iVar4 < iVar6) {
      pLVar10 = vec<Minisat::Lit>::operator[](&in_RDI->add_tmp,local_f8);
      var((Lit)pLVar10->x);
      iVar6 = level((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                    (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (*local_20 + -1 <= iVar6) {
        varBumpActivity((Solver *)CONCAT44(iVar4,in_stack_fffffffffffffe10),
                        (Var)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                        (double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      }
      local_f8 = local_f8 + 1;
    }
    vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
  }
  else {
    pvVar15 = &in_RDI->seen;
    iVar4 = var(local_30);
    pcVar12 = vec<char>::operator[](pvVar15,iVar4);
    *pcVar12 = '\x01';
    local_108 = vec<Minisat::Lit>::size(local_18);
    while (local_108 = local_108 + -1, -1 < local_108) {
      pLVar10 = vec<Minisat::Lit>::operator[](local_18,local_108);
      var((Lit)pLVar10->x);
      CVar8 = reason((Solver *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     (Var)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if (CVar8 != 0xffffffff) {
        pCVar9 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (Ref)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        local_124 = 0;
        while (iVar4 = local_124, iVar6 = Clause::size(pCVar9), iVar4 < iVar6) {
          LVar5 = Clause::operator[](pCVar9,local_124);
          pvVar15 = &in_RDI->seen;
          iVar4 = var(LVar5);
          pcVar12 = vec<char>::operator[](pvVar15,iVar4);
          if (*pcVar12 == '\0') {
            pvVar15 = &in_RDI->seen;
            iVar4 = var(LVar5);
            pcVar12 = vec<char>::operator[](pvVar15,iVar4);
            *pcVar12 = '\x01';
            this_00 = &in_RDI->almost_conflicted;
            iVar4 = var(LVar5);
            puVar13 = vec<unsigned_int>::operator[](this_00,iVar4);
            *puVar13 = *puVar13 + 1;
            vec<Minisat::Lit>::push
                      ((vec<Minisat::Lit> *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
          }
          local_124 = local_124 + 1;
        }
      }
    }
  }
  local_138 = 0;
  while (iVar4 = local_138, iVar6 = vec<Minisat::Lit>::size(&in_RDI->analyze_toclear), iVar4 < iVar6
        ) {
    pvVar15 = &in_RDI->seen;
    pLVar10 = vec<Minisat::Lit>::operator[](&in_RDI->analyze_toclear,local_138);
    iVar4 = var((Lit)pLVar10->x);
    pcVar12 = vec<char>::operator[](pvVar15,iVar4);
    *pcVar12 = '\0';
    local_138 = local_138 + 1;
  }
  return;
}

Assistant:

void Solver::analyze(CRef confl, vec<Lit> &out_learnt, int &out_btlevel, int &out_lbd)
{
    int pathC = 0;
    Lit p = lit_Undef;

    // Generate conflict clause:
    //
    out_learnt.push(); // (leave room for the asserting literal)
    int index = trail.size() - 1;
    int nDecisionLevel = level(var(ca[confl][0]));
    assert(nDecisionLevel == level(var(ca[confl][0])));

    do {
        assert(confl != CRef_Undef); // (otherwise should be UIP)
        Clause &c = ca[confl];
        statistics.solveSteps++;

        // For binary clauses, we don't rearrange literals in propagate(), so check and make sure the first is an implied lit.
        if (p != lit_Undef && c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        // Update LBD if improved.
        if (c.learnt()) {
            if (c.mark() == CORE) {
                c.touched() = conflicts;
            } else {
                int lbd = computeLBD(c);
                if (lbd < c.lbd()) {
                    if (c.lbd() <= 30) c.removable(false); // Protect once from reduction.
                    c.set_lbd(lbd);
                    if (lbd <= core_lbd_cut) {
                        learnts_core.push(confl);
                        c.mark(CORE);
                    } else if (lbd <= 6 && c.mark() == LOCAL) {
                        // Bug: 'cr' may already be in 'learnts_tier2', e.g., if 'cr' was demoted from TIER2
                        // to LOCAL previously and if that 'cr' is not cleaned from 'learnts_tier2' yet.
                        learnts_tier2.push(confl);
                        c.mark(TIER2);
                    }
                }

                if (c.mark() == TIER2)
                    c.touched() = conflicts;
                else if (c.mark() == LOCAL)
                    claBumpActivity(c);
            }
        }

        for (int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++) {
            Lit q = c[j];

            if (!seen[var(q)] && level(var(q)) > 0) {
                if (usesVSIDS()) {
                    varBumpActivity(var(q), .5);
                    add_tmp.push(q);
                } else
                    conflicted[var(q)]++;
                seen[var(q)] = 1;
                if (level(var(q)) >= nDecisionLevel) {
                    pathC++;
                } else
                    out_learnt.push(q);
            }
        }

        // Select next clause to look at:
        do {
            while (!seen[var(trail[index--])])
                ;
            p = trail[index + 1];
        } while (level(var(p)) < nDecisionLevel);

        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    } while (pathC > 0);
    out_learnt[0] = ~p;

    // Simplify conflict clause:
    //
    int i, j;
    out_learnt.copyTo(analyze_toclear);
    if (ccmin_mode == 2) {
        uint32_t abstract_level = 0;
        for (i = 1; i < out_learnt.size(); i++)
            abstract_level |= abstractLevel(var(out_learnt[i])); // (maintain an abstraction of levels involved in conflict)

        for (i = j = 1; i < out_learnt.size(); i++)
            if (reason(var(out_learnt[i])) == CRef_Undef || !litRedundant(out_learnt[i], abstract_level))
                out_learnt[j++] = out_learnt[i];

    } else if (ccmin_mode == 1) {
        for (i = j = 1; i < out_learnt.size(); i++) {
            Var x = var(out_learnt[i]);

            if (reason(x) == CRef_Undef)
                out_learnt[j++] = out_learnt[i];
            else {
                Clause &c = ca[reason(var(out_learnt[i]))];

                statistics.solveSteps++;
                for (int k = c.size() == 2 ? 0 : 1; k < c.size(); k++)
                    if (!seen[var(c[k])] && level(var(c[k])) > 0) {
                        out_learnt[j++] = out_learnt[i];
                        break;
                    }
            }
        }
    } else
        i = j = out_learnt.size();

    max_literals += out_learnt.size();
    out_learnt.shrink(i - j);
    tot_literals += out_learnt.size();

    out_lbd = computeLBD(out_learnt);
    if (out_lbd <= 6 && out_learnt.size() <= 30)                          // Try further minimization?
        if (binResMinimize(out_learnt)) out_lbd = computeLBD(out_learnt); // Recompute LBD if minimized.

    // Find correct backtrack level:
    //
    if (out_learnt.size() == 1)
        out_btlevel = 0;
    else {
        int max_i = 1;
        // Find the first literal assigned at the next-highest level:
        int max_bump_size = max_activity_bump_size;
        max_bump_size = out_learnt.size() <= max_bump_size ? out_learnt.size() : max_bump_size;
        for (int i = 2; i < out_learnt.size(); i++)
            if (level(var(out_learnt[i])) > level(var(out_learnt[max_i]))) max_i = i;
        // Swap-in this literal at index 1:
        Lit p = out_learnt[max_i];
        out_learnt[max_i] = out_learnt[1];
        out_learnt[1] = p;
        out_btlevel = level(var(p));
    }

    if (usesVSIDS()) {
        for (int i = 0; i < add_tmp.size(); i++) {
            Var v = var(add_tmp[i]);
            if (level(v) >= out_btlevel - 1) varBumpActivity(v, 1);
        }
        add_tmp.clear();
    } else {
        seen[var(p)] = true;
        for (int i = out_learnt.size() - 1; i >= 0; i--) {
            Var v = var(out_learnt[i]);
            CRef rea = reason(v);
            if (rea != CRef_Undef) {
                const Clause &reaC = ca[rea];
                for (int i = 0; i < reaC.size(); i++) {
                    Lit l = reaC[i];
                    if (!seen[var(l)]) {
                        seen[var(l)] = true;
                        almost_conflicted[var(l)]++;
                        analyze_toclear.push(l);
                    }
                }
            }
        }
    }

    for (int j = 0; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0; // ('seen[]' is now cleared)
}